

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManPrint_rec(FILE *pFile,If_DsdMan_t *p,int iDsdLit,uchar *pPermLits,int *pnSupp)

{
  int *piVar1;
  Vec_Mem_t *pVVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *__s;
  long lVar8;
  long lVar9;
  char *pcVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  long lVar14;
  
  if (iDsdLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  pcVar10 = "!";
  __s = "!";
  if ((iDsdLit & 1U) == 0) {
    __s = "";
  }
  fputs(__s,(FILE *)pFile);
  if ((p->vObjs).nSize <= (int)((uint)iDsdLit >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar1 = (int *)(p->vObjs).pArray[(uint)iDsdLit >> 1];
  uVar6 = piVar1[1];
  uVar5 = uVar6 & 7;
  if (uVar5 == 6) {
    pVVar2 = p->vTtMem[uVar6 >> 0x1b];
    uVar5 = 0xffffffff;
    if (0x17ffffff < uVar6) {
      iVar7 = *piVar1;
      if (((long)iVar7 < 0) || ((p->vTruths).nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar5 = (p->vTruths).pArray[iVar7];
    }
    if (((int)uVar5 < 0) || (pVVar2->nEntries <= (int)uVar5)) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    bVar4 = (byte)(uVar6 >> 0x18);
    if (uVar6 < 0x10000000) {
      __assert_fail("nVars >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
    }
    puVar11 = pVVar2->ppPages[uVar5 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
              (long)(int)(uVar5 & pVVar2->PageMask) * (long)pVVar2->nEntrySize;
    uVar5 = 1 << ((bVar4 >> 3) - 6 & 0x1f);
    if (uVar6 < 0x38000000) {
      uVar5 = 1;
    }
    puVar12 = puVar11 + ((ulong)uVar5 - 1);
    if (puVar11 <= puVar12) {
      uVar13 = 0xf;
      if (uVar6 < 0x30000000) {
        uVar13 = (ulong)(uint)~(-1 << ((bVar4 >> 3) - 2 & 0x1f));
      }
      lVar8 = uVar13 + 1;
      lVar14 = uVar13 << 2;
      do {
        uVar6 = (uint)(*puVar12 >> ((byte)lVar14 & 0x3c)) & 0xf;
        iVar7 = uVar6 + 0x30;
        if (9 < uVar6) {
          iVar7 = uVar6 + 0x37;
        }
        fputc(iVar7,(FILE *)pFile);
        lVar9 = lVar8 + -1;
        bVar3 = 0 < lVar8;
        lVar8 = lVar9;
        lVar14 = lVar14 + -4;
      } while ((lVar9 != 0 && bVar3) ||
              (puVar12 = puVar12 + -1, lVar8 = uVar13 + 1, lVar14 = uVar13 << 2, puVar11 <= puVar12)
              );
    }
  }
  else {
    if (uVar5 == 2) {
      iVar7 = *pnSupp;
      *pnSupp = iVar7 + 1;
      if (pPermLits == (uchar *)0x0) {
        if (iVar7 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar6 = iVar7 * 2;
      }
      else {
        uVar6 = (uint)pPermLits[iVar7];
      }
      if ((uVar6 & 1) == 0) {
        pcVar10 = "";
      }
      fprintf((FILE *)pFile,"%s%c",pcVar10,(ulong)((uVar6 >> 1) + 0x61));
      return;
    }
    if (uVar5 == 1) {
      iVar7 = 0x30;
      goto LAB_0041f814;
    }
  }
  fputc((int)(char)(&DAT_009aee80)[piVar1[1] & 7],(FILE *)pFile);
  uVar6 = piVar1[1];
  if ((0x7ffffff < uVar6) && (iVar7 = piVar1[2], iVar7 != 0)) {
    uVar13 = 1;
    do {
      If_DsdManPrint_rec(pFile,p,iVar7,pPermLits,pnSupp);
      uVar6 = piVar1[1];
      if (uVar6 >> 0x1b <= uVar13) break;
      iVar7 = piVar1[uVar13 + 2];
      uVar13 = uVar13 + 1;
    } while (iVar7 != 0);
  }
  iVar7 = (int)(char)(&DAT_009aee87)[uVar6 & 7];
LAB_0041f814:
  fputc(iVar7,(FILE *)pFile);
  return;
}

Assistant:

void If_DsdManPrint_rec( FILE * pFile, If_DsdMan_t * p, int iDsdLit, unsigned char * pPermLits, int * pnSupp )
{
    char OpenType[7]  = {0, 0, 0, '(', '[', '<', '{'};
    char CloseType[7] = {0, 0, 0, ')', ']', '>', '}'};
    If_DsdObj_t * pObj;
    int i, iFanin;
    fprintf( pFile, "%s", Abc_LitIsCompl(iDsdLit) ? "!" : ""  );
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsdLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        { fprintf( pFile, "0" ); return; }
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[(*pnSupp)++] : Abc_Var2Lit((*pnSupp)++, 0);
        fprintf( pFile, "%s%c", Abc_LitIsCompl(iPermLit)? "!":"", 'a' + Abc_Lit2Var(iPermLit) );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
        Abc_TtPrintHexRev( pFile, If_DsdObjTruth(p, pObj), If_DsdObjFaninNum(pObj) );
    fprintf( pFile, "%c", OpenType[If_DsdObjType(pObj)] );
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        If_DsdManPrint_rec( pFile, p, iFanin, pPermLits, pnSupp );
    fprintf( pFile, "%c", CloseType[If_DsdObjType(pObj)] );
}